

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O0

void __thiscall
CDirectiveConditional::setContent
          (CDirectiveConditional *this,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *ifBlock,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *elseBlock)

{
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *elseBlock_local;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *ifBlock_local;
  CDirectiveConditional *this_local;
  
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->ifBlock,ifBlock);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->elseBlock,elseBlock);
  return;
}

Assistant:

void CDirectiveConditional::setContent(std::unique_ptr<CAssemblerCommand> ifBlock, std::unique_ptr<CAssemblerCommand> elseBlock)
{
	this->ifBlock = std::move(ifBlock);
	this->elseBlock = std::move(elseBlock);
}